

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O2

ScalarFunction * duckdb::FormatreadabledecimalsizeFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_91;
  code *local_90 [2];
  code *local_80;
  code *local_78;
  LogicalType local_70 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  LogicalType local_40 [24];
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LogicalType(local_28,BIGINT);
  __l._M_len = 1;
  __l._M_array = local_28;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_58,__l,&local_91);
  duckdb::LogicalType::LogicalType(local_70,VARCHAR);
  local_90[1] = (code *)0x0;
  local_90[0] = FormatBytesFunction<1000l>;
  local_78 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_40,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_40);
  std::_Function_base::~_Function_base((_Function_base *)local_90);
  duckdb::LogicalType::~LogicalType(local_70);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  duckdb::LogicalType::~LogicalType(local_28);
  return in_RDI;
}

Assistant:

ScalarFunction FormatreadabledecimalsizeFun::GetFunction() {
	return ScalarFunction({LogicalType::BIGINT}, LogicalType::VARCHAR, FormatBytesFunction<1000>);
}